

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O1

ngx_int_t ngx_http_variable_request_time
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  undefined1 auVar1 [16];
  u_char *buf;
  u_char *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  buf = (u_char *)ngx_pnalloc(r->pool,0x18);
  if (buf == (u_char *)0x0) {
    uVar5 = 0xffffffffffffffff;
  }
  else {
    uVar3 = (ngx_cached_time->msec - r->start_msec) + (ngx_cached_time->sec - r->start_sec) * 1000;
    uVar5 = 0;
    if ((long)uVar3 < 1) {
      uVar3 = uVar5;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(0x20c49ba5e353f7cf),8) >> 7;
    puVar2 = ngx_sprintf(buf,"%T.%03M",uVar4,uVar3 + uVar4 * -1000);
    *(uint *)v = ((int)puVar2 - (int)buf & 0xfffffffU) + (*(uint *)v & 0x80000000) + 0x10000000;
    v->data = buf;
  }
  return uVar5;
}

Assistant:

static ngx_int_t
ngx_http_variable_request_time(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    u_char          *p;
    ngx_time_t      *tp;
    ngx_msec_int_t   ms;

    p = ngx_pnalloc(r->pool, NGX_TIME_T_LEN + 4);
    if (p == NULL) {
        return NGX_ERROR;
    }

    tp = ngx_timeofday();

    ms = (ngx_msec_int_t)
             ((tp->sec - r->start_sec) * 1000 + (tp->msec - r->start_msec));
    ms = ngx_max(ms, 0);

    v->len = ngx_sprintf(p, "%T.%03M", (time_t) ms / 1000, ms % 1000) - p;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;
    v->data = p;

    return NGX_OK;
}